

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O0

bool __thiscall DropdownMenu::update(DropdownMenu *this,int mouseX,int mouseY,bool clicked)

{
  float fVar1;
  float fVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  Vector2f *pVVar6;
  iterator iVar7;
  reference pTVar8;
  byte in_CL;
  int in_EDX;
  int in_ESI;
  Shape *in_RDI;
  TextButton *b;
  iterator __end2;
  iterator __begin2;
  vector<TextButton,_std::allocator<TextButton>_> *__range2;
  bool buttonSelected;
  bool clickDone;
  Color *in_stack_ffffffffffffffb8;
  __normal_iterator<TextButton_*,_std::vector<TextButton,_std::allocator<TextButton>_>_>
  in_stack_ffffffffffffffd8;
  undefined1 clicked_00;
  float *in_stack_ffffffffffffffe0;
  undefined5 in_stack_ffffffffffffffe8;
  byte in_stack_ffffffffffffffed;
  byte in_stack_ffffffffffffffee;
  
  clicked_00 = (undefined1)((ulong)in_stack_ffffffffffffffd8._M_current >> 0x38);
  bVar3 = in_CL & 1;
  pVVar6 = sf::Transformable::getPosition(&in_RDI->super_Transformable);
  fVar1 = pVVar6->x;
  pVVar6 = sf::Transformable::getPosition(&in_RDI->super_Transformable);
  fVar2 = pVVar6->y;
  if (((in_RDI->super_Transformable).field_0xa9 & 1) != 0) {
    in_stack_ffffffffffffffee = bVar3 & 1;
    in_stack_ffffffffffffffed = 0;
    in_stack_ffffffffffffffe0 = in_RDI[4].super_Transformable.m_inverseTransform.m_matrix + 4;
    iVar7 = std::vector<TextButton,_std::allocator<TextButton>_>::begin
                      ((vector<TextButton,_std::allocator<TextButton>_> *)in_stack_ffffffffffffffb8)
    ;
    std::vector<TextButton,_std::allocator<TextButton>_>::end
              ((vector<TextButton,_std::allocator<TextButton>_> *)in_stack_ffffffffffffffb8);
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<TextButton_*,_std::vector<TextButton,_std::allocator<TextButton>_>_>
                               *)in_RDI,
                              (__normal_iterator<TextButton_*,_std::vector<TextButton,_std::allocator<TextButton>_>_>
                               *)in_stack_ffffffffffffffb8),
          clicked_00 = (undefined1)((ulong)iVar7._M_current >> 0x38), bVar4) {
      pTVar8 = __gnu_cxx::
               __normal_iterator<TextButton_*,_std::vector<TextButton,_std::allocator<TextButton>_>_>
               ::operator*((__normal_iterator<TextButton_*,_std::vector<TextButton,_std::allocator<TextButton>_>_>
                            *)&stack0xffffffffffffffd8);
      uVar5 = (*(pTVar8->super_UIComponent).super_Drawable._vptr_Drawable[3])
                        (pTVar8,(ulong)(uint)(in_ESI - (int)fVar1),
                         (ulong)(uint)(in_EDX - (int)fVar2),(ulong)(in_stack_ffffffffffffffee & 1));
      if ((uVar5 & 1) != 0) {
        in_stack_ffffffffffffffee = 0;
      }
      if (((pTVar8->selected & 1U) == 0) || ((in_stack_ffffffffffffffed & 1) != 0)) {
        if ((pTVar8->selected & 1U) != 0) {
          sf::Shape::setFillColor(in_RDI,in_stack_ffffffffffffffb8);
          pTVar8->selected = false;
        }
      }
      else {
        in_stack_ffffffffffffffed = 1;
      }
      __gnu_cxx::
      __normal_iterator<TextButton_*,_std::vector<TextButton,_std::allocator<TextButton>_>_>::
      operator++((__normal_iterator<TextButton_*,_std::vector<TextButton,_std::allocator<TextButton>_>_>
                  *)&stack0xffffffffffffffd8);
    }
  }
  bVar4 = TextButton::update((TextButton *)
                             CONCAT17(bVar3,CONCAT16(in_stack_ffffffffffffffee,
                                                     CONCAT15(in_stack_ffffffffffffffed,
                                                              in_stack_ffffffffffffffe8))),
                             (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                             (int)in_stack_ffffffffffffffe0,(bool)clicked_00);
  if (bVar4) {
    (in_RDI->super_Transformable).field_0xa9 = ((in_RDI->super_Transformable).field_0xa9 ^ 0xff) & 1
    ;
  }
  else if ((bVar3 & 1) != 0) {
    (in_RDI->super_Transformable).field_0xa9 = 0;
  }
  return false;
}

Assistant:

bool DropdownMenu::update(int mouseX, int mouseY, bool clicked) {
    mouseX -= static_cast<int>(getPosition().x);
    mouseY -= static_cast<int>(getPosition().y);
    if (visible) {
        bool clickDone = clicked, buttonSelected = false;
        for (TextButton& b : menuButtons) {
            if (b.update(mouseX, mouseY, clickDone)) {    // Only one button in the menu can be pressed.
                clickDone = false;
            }
            if (b.selected && !buttonSelected) {
                buttonSelected = true;
            } else if (b.selected) {
                b.button.setFillColor(b.color1);
                b.selected = false;
            }
        }
    }
    if (button.update(mouseX, mouseY, clicked)) {
        visible = !visible;
    } else if (clicked) {
        visible = false;
    }
    return false;
}